

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

void __thiscall
wasm::DataFlow::Graph::mergeIf
          (Graph *this,Locals *aState,Locals *bState,Node *condition,Expression *expr,Locals *out)

{
  bool bVar1;
  undefined1 local_68 [8];
  vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_> states
  ;
  mapped_type *conditions;
  Node *ifFalse;
  Node *ifTrue;
  Locals *out_local;
  Expression *expr_local;
  Node *condition_local;
  Locals *bState_local;
  Locals *aState_local;
  Graph *this_local;
  
  ifTrue = (Node *)out;
  out_local = (Locals *)expr;
  expr_local = (Expression *)condition;
  condition_local = (Node *)bState;
  bState_local = aState;
  aState_local = (Locals *)this;
  bVar1 = Node::isBad(condition);
  conditions = (mapped_type *)this;
  ifFalse = &this->bad;
  if (!bVar1) {
    states.
    super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  unordered_map<wasm::Expression_*,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>
                  ::operator[](&this->expressionConditionMap,(key_type *)&out_local);
    ifFalse = ensureI1(this,(Node *)expr_local,(Expression *)0x0);
    std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::push_back
              (&(states.
                 super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->locals,&ifFalse);
    conditions = (mapped_type *)makeZeroComp(this,(Node *)expr_local,true,(Expression *)0x0);
    std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::push_back
              (&(states.
                 super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->locals,
               (value_type *)&conditions);
  }
  std::vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>::
  vector((vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
          *)local_68);
  bVar1 = isInUnreachable(this,bState_local);
  if (!bVar1) {
    std::vector<wasm::DataFlow::Graph::FlowState,std::allocator<wasm::DataFlow::Graph::FlowState>>::
    emplace_back<std::vector<wasm::DataFlow::Node*,std::allocator<wasm::DataFlow::Node*>>&,wasm::DataFlow::Node*&>
              ((vector<wasm::DataFlow::Graph::FlowState,std::allocator<wasm::DataFlow::Graph::FlowState>>
                *)local_68,bState_local,&ifFalse);
  }
  bVar1 = isInUnreachable(this,(Locals *)condition_local);
  if (!bVar1) {
    std::vector<wasm::DataFlow::Graph::FlowState,std::allocator<wasm::DataFlow::Graph::FlowState>>::
    emplace_back<std::vector<wasm::DataFlow::Node*,std::allocator<wasm::DataFlow::Node*>>&,wasm::DataFlow::Node*&>
              ((vector<wasm::DataFlow::Graph::FlowState,std::allocator<wasm::DataFlow::Graph::FlowState>>
                *)local_68,
               (vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)
               condition_local,(Node **)&conditions);
  }
  merge(this,(vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
              *)local_68,(Locals *)ifTrue);
  std::vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>::
  ~vector((vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
           *)local_68);
  return;
}

Assistant:

void mergeIf(Locals& aState,
               Locals& bState,
               Node* condition,
               Expression* expr,
               Locals& out) {
    // Create the conditions (if we can).
    Node* ifTrue;
    Node* ifFalse;
    if (!condition->isBad()) {
      // Generate boolean (i1 returning) conditions for the two branches.
      auto& conditions = expressionConditionMap[expr];
      ifTrue = ensureI1(condition, nullptr);
      conditions.push_back(ifTrue);
      ifFalse = makeZeroComp(condition, true, nullptr);
      conditions.push_back(ifFalse);
    } else {
      ifTrue = ifFalse = &bad;
    }
    // Finally, merge the state with that block. TODO optimize
    std::vector<FlowState> states;
    if (!isInUnreachable(aState)) {
      states.emplace_back(aState, ifTrue);
    }
    if (!isInUnreachable(bState)) {
      states.emplace_back(bState, ifFalse);
    }
    merge(states, out);
  }